

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

ssize_t __thiscall DomResource::read(DomResource *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  int iVar2;
  const_iterator o;
  undefined4 in_register_00000034;
  QStringView *size;
  long in_FS_OFFSET;
  QXmlStreamAttribute *attribute;
  QXmlStreamAttributes *__range1;
  QXmlStreamAttributes *attributes;
  QStringView tag;
  QStringView name;
  const_iterator __end1;
  const_iterator __begin1;
  QStringBuilder<QLatin1String,_const_QStringView_&> *in_stack_fffffffffffffe78;
  DomResource *in_stack_fffffffffffffe80;
  QStringView *a;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  QStringView *in_stack_fffffffffffffe90;
  undefined7 in_stack_fffffffffffffe98;
  byte in_stack_fffffffffffffe9f;
  const_iterator local_28 [4];
  long local_8;
  
  size = (QStringView *)CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QXmlStreamReader::attributes();
  local_28[0].i = (QXmlStreamAttribute *)0xaaaaaaaaaaaaaaaa;
  local_28[0] = QList<QXmlStreamAttribute>::begin
                          ((QList<QXmlStreamAttribute> *)in_stack_fffffffffffffe80);
  o = QList<QXmlStreamAttribute>::end((QList<QXmlStreamAttribute> *)in_stack_fffffffffffffe80);
  while (bVar1 = QList<QXmlStreamAttribute>::const_iterator::operator!=(local_28,o), bVar1) {
    QList<QXmlStreamAttribute>::const_iterator::operator*(local_28);
    QXmlStreamAttribute::name((QXmlStreamAttribute *)0x1a4750);
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
               (size_t)in_stack_fffffffffffffe90);
    QStringView::QStringView<QString,_true>
              (in_stack_fffffffffffffe90,
               (QString *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    in_stack_fffffffffffffe9f =
         ::operator==((QStringView *)in_stack_fffffffffffffe80,
                      (QStringView *)in_stack_fffffffffffffe78);
    QString::~QString((QString *)0x1a47b4);
    if ((in_stack_fffffffffffffe9f & 1) == 0) {
      in_stack_fffffffffffffe90 = size;
      Qt::Literals::StringLiterals::operator____L1
                ((char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                 (size_t)in_stack_fffffffffffffe80);
      ::operator+((QLatin1String *)in_stack_fffffffffffffe80,
                  (QStringView *)in_stack_fffffffffffffe78);
      ::QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffe78);
      QXmlStreamReader::raiseError((QString *)in_stack_fffffffffffffe90);
      QString::~QString((QString *)0x1a488a);
    }
    else {
      QXmlStreamAttribute::value((QXmlStreamAttribute *)0x1a47c8);
      QStringView::toString((QStringView *)in_stack_fffffffffffffe80);
      setAttributeLocation(in_stack_fffffffffffffe80,(QString *)in_stack_fffffffffffffe78);
      QString::~QString((QString *)0x1a480c);
    }
    QList<QXmlStreamAttribute>::const_iterator::operator++(local_28);
  }
  do {
    while( true ) {
      bVar1 = QXmlStreamReader::hasError((QXmlStreamReader *)0x1a48a8);
      if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_001a499c;
      iVar2 = QXmlStreamReader::readNext();
      if (iVar2 != 4) break;
      QXmlStreamReader::name();
      a = size;
      Qt::Literals::StringLiterals::operator____L1
                ((char *)CONCAT44(iVar2,in_stack_fffffffffffffe88),(size_t)size);
      ::operator+((QLatin1String *)a,(QStringView *)in_stack_fffffffffffffe78);
      ::QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffe78);
      QXmlStreamReader::raiseError((QString *)a);
      QString::~QString((QString *)0x1a4981);
    }
  } while (iVar2 != 5);
LAB_001a499c:
  QXmlStreamAttributes::~QXmlStreamAttributes((QXmlStreamAttributes *)0x1a49a9);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomResource::read(QXmlStreamReader &reader)
{
    const QXmlStreamAttributes &attributes = reader.attributes();
    for (const QXmlStreamAttribute &attribute : attributes) {
        const auto name = attribute.name();
        if (name == u"location"_s) {
            setAttributeLocation(attribute.value().toString());
            continue;
        }
        reader.raiseError("Unexpected attribute "_L1 + name);
    }

    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}